

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternAddressMapper.cpp
# Opt level: O1

void __thiscall
PatternAddressMapper::compute_mapping_stats
          (PatternAddressMapper *this,
          vector<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>
          *agg_access_patterns,int *agg_intra_distance,int *agg_inter_distance,
          bool uses_seq_addresses)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pAVar2;
  pointer pAVar3;
  pointer pAVar4;
  bool bVar5;
  size_t sVar6;
  mapped_type *pmVar7;
  undefined8 uVar8;
  int iVar9;
  long lVar10;
  char *args;
  pointer pAVar11;
  long lVar12;
  vector<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_> *pvVar13;
  vector<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_> *pvVar14;
  vector<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_> *__range1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Deriving mapping parameters from AggressorAccessPatterns.","");
  Logger::log_info(&local_50,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  *agg_intra_distance = 0;
  for (pAVar11 = (agg_access_patterns->
                 super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      pAVar11 !=
      (agg_access_patterns->
      super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>)._M_impl.
      super__Vector_impl_data._M_finish; pAVar11 = pAVar11 + 1) {
    pAVar2 = (pAVar11->aggressors).super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl
             .super__Vector_impl_data._M_start;
    if (4 < (ulong)((long)(pAVar11->aggressors).
                          super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pAVar2)) {
      pmVar7 = std::__detail::
               _Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&this->aggressor_to_addr,&pAVar2[1].id);
      pAVar2 = (pAVar11->aggressors).super__Vector_base<Aggressor,_std::allocator<Aggressor>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pvVar14 = (vector<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_> *)
                agg_intra_distance;
      if ((pAVar11->aggressors).super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
          super__Vector_impl_data._M_finish == pAVar2) goto LAB_0013ec78;
      sVar6 = pmVar7->row;
      pmVar7 = std::__detail::
               _Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&this->aggressor_to_addr,&pAVar2->id);
      *agg_intra_distance = (int)sVar6 - (int)pmVar7->row;
      break;
    }
  }
  *agg_inter_distance = -1;
  pvVar14 = (vector<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_> *)
            CONCAT71((int7)((ulong)agg_intra_distance >> 8),1);
  pAVar4 = (agg_access_patterns->
           super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>).
           _M_impl.super__Vector_impl_data._M_start;
  do {
    pAVar11 = pAVar4 + 1;
    if (pAVar11 ==
        (agg_access_patterns->
        super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>)._M_impl
        .super__Vector_impl_data._M_finish) {
      pvVar13 = (vector<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_> *)
                ((ulong)pvVar14 & 0xffffffff);
      break;
    }
    pAVar2 = (pAVar4->aggressors).super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
             super__Vector_impl_data._M_start;
    pAVar3 = (pAVar4->aggressors).super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar10 = (long)pAVar3 - (long)pAVar2 >> 2;
    lVar12 = lVar10 + -1;
    if (pAVar3 == pAVar2) goto LAB_0013ec8c;
    pmVar7 = std::__detail::
             _Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&this->aggressor_to_addr,&pAVar2[lVar12].id);
    pAVar2 = pAVar4[1].aggressors.super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pAVar4[1].aggressors.super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
        super__Vector_impl_data._M_finish == pAVar2) goto LAB_0013ec78;
    sVar6 = pmVar7->row;
    pmVar7 = std::__detail::
             _Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&this->aggressor_to_addr,&pAVar2->id);
    iVar9 = (int)pmVar7->row - (int)sVar6;
    if (*agg_inter_distance == -1) {
      *agg_inter_distance = iVar9;
LAB_0013eb0f:
      bVar5 = true;
      pvVar13 = (vector<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_> *)
                ((ulong)pvVar14 & 0xffffffff);
    }
    else {
      bVar5 = false;
      pvVar13 = (vector<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_> *)0x0;
      if (*agg_inter_distance == iVar9) goto LAB_0013eb0f;
    }
    pvVar14 = pvVar13;
    pAVar4 = pAVar11;
  } while (bVar5);
  __range1 = (vector<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_> *)&local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&__range1,"inter-distance v = %d","");
  format_string<int>(&local_50,(string *)&__range1,*agg_inter_distance);
  paVar1 = &local_50.field_2;
  Logger::log_data(&local_50,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__range1 != &local_60) {
    operator_delete(__range1,local_60._M_allocated_capacity + 1);
  }
  __range1 = (vector<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_> *)&local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&__range1,"intra-distance d = %d","");
  format_string<int>(&local_50,(string *)&__range1,*agg_intra_distance);
  Logger::log_data(&local_50,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__range1 != &local_60) {
    operator_delete(__range1,local_60._M_allocated_capacity + 1);
  }
  __range1 = (vector<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_> *)&local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&__range1,"use_seq_addresses = %s","");
  args = "false";
  if ((char)pvVar13 != '\0') {
    args = "true";
  }
  format_string<char_const*>(&local_50,(string *)&__range1,args);
  Logger::log_data(&local_50,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__range1 != &local_60) {
    operator_delete(__range1,local_60._M_allocated_capacity + 1);
  }
  return;
LAB_0013ec78:
  lVar12 = 0;
  lVar10 = 0;
LAB_0013ec8c:
  uVar8 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     lVar12,lVar10);
  if ((pointer)local_50._M_dataplus._M_p != pAVar11) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (__range1 != pvVar14) {
    operator_delete(__range1,local_60._M_allocated_capacity + 1);
  }
  _Unwind_Resume(uVar8);
}

Assistant:

void PatternAddressMapper::compute_mapping_stats(std::vector<AggressorAccessPattern> &agg_access_patterns,
                                                 int &agg_intra_distance, int &agg_inter_distance,
                                                 bool uses_seq_addresses) {
  Logger::log_info("Deriving mapping parameters from AggressorAccessPatterns.");

  // find first AggressorAccessPattern with more than one aggressor, then compute distance in-between aggressors
  agg_intra_distance = 0;
  for (auto &agg_access_pattern : agg_access_patterns) {
    if (agg_access_pattern.aggressors.size() > 1) {
      auto r1 = aggressor_to_addr.at(agg_access_pattern.aggressors.at(1).id).row;
      auto r0 = aggressor_to_addr.at(agg_access_pattern.aggressors.at(0).id).row;
      agg_intra_distance = static_cast<int>(r1-r0);
      break;
    }
  }

  // if all consecutive AggressorAccessPatterns have the same inter-distance, then they use "sequential addresses"
  uses_seq_addresses = true;
  agg_inter_distance = -1;
  for (auto it = agg_access_patterns.begin(); it+1 != agg_access_patterns.end(); ++it) {
    auto this_size = it->aggressors.size();
    auto this_row = aggressor_to_addr.at(it->aggressors.at(this_size-1).id).row;
    auto next_row = aggressor_to_addr.at((it+1)->aggressors.at(0).id).row;
    auto distance = static_cast<int>(next_row - this_row);
    if (agg_inter_distance == -1) {
        agg_inter_distance = distance;
    } else if (agg_inter_distance != distance) {
      uses_seq_addresses = false;
      break;
    }
  }

  Logger::log_data(format_string("inter-distance v = %d", agg_inter_distance));
  Logger::log_data(format_string("intra-distance d = %d", agg_intra_distance));
  Logger::log_data(format_string("use_seq_addresses = %s", (uses_seq_addresses ? "true" : "false")));
}